

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O3

tuple<unsigned_long,_unsigned_long,_int> * __thiscall
greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t_&>
::get_coboundary_size_and_gap_and_pivot
          (tuple<unsigned_long,_unsigned_long,_int> *__return_storage_ptr__,
          greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t_&>
          *this,filtration_entry_t a)

{
  pointer puVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  filtration_entry_t fVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  unsigned_long uVar9;
  int iVar10;
  unsigned_long uVar11;
  coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  iterator;
  coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  local_58;
  
  local_58.complex = this->complex;
  if (((int)(uint)(local_58.complex)->max_dimension < (local_58.complex)->current_dimension) ||
     ((local_58.complex)->_is_top_dimension != false)) {
    local_58.matrix =
         ((local_58.complex)->coboundary_matrix).
         super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_58.index = -1;
  }
  else {
    puVar1 = ((local_58.complex)->coboundary_matrix_offsets).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = -1;
    do {
      lVar7 = (local_58.complex)->nb_threads - 1;
      if ((1 - (local_58.complex)->nb_threads) + lVar8 == -1) break;
      lVar7 = lVar8 + 1;
      lVar2 = lVar8 + 2;
      lVar8 = lVar7;
    } while ((int)puVar1[lVar2] <= a.super_pair<float,_int>.second);
    local_58.matrix =
         ((local_58.complex)->coboundary_matrix).
         super__Vector_base<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
         ._M_impl.super__Vector_impl_data._M_start + lVar7;
    local_58.index = a.super_pair<float,_int>.second - (int)puVar1[lVar7];
  }
  local_58.modulus = (local_58.complex)->modulus;
  local_58.dimension = (short)(local_58.complex)->current_dimension;
  local_58.coefficient = 1;
  local_58.current_offset = 0;
  bVar3 = directed_flag_complex_in_memory_computer::
          coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
          ::has_next(&local_58);
  if (bVar3) {
    uVar11 = 0;
    uVar9 = 0;
    iVar6 = 0;
    do {
      uVar11 = uVar11 + 1;
      fVar5 = directed_flag_complex_in_memory_computer::
              coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
              ::next(&local_58);
      iVar4 = fVar5.super_pair<float,_int>.second;
      iVar10 = iVar4;
      if (iVar6 - iVar4 != 0 && iVar4 <= iVar6) {
        iVar10 = iVar6;
      }
      if (iVar6 < iVar4) {
        uVar9 = (long)-(iVar6 - iVar4);
      }
      bVar3 = directed_flag_complex_in_memory_computer::
              coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
              ::has_next(&local_58);
      iVar6 = iVar10;
    } while (bVar3);
  }
  else {
    iVar10 = 0;
    uVar9 = 0;
    uVar11 = 0;
  }
  (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
  super__Tuple_impl<1UL,_unsigned_long,_int>.super__Tuple_impl<2UL,_int>.
  super__Head_base<2UL,_int,_false>._M_head_impl = iVar10;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
  super__Tuple_impl<1UL,_unsigned_long,_int>.super__Head_base<1UL,_unsigned_long,_false>.
  _M_head_impl = uVar9;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar11;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<size_t, size_t, index_t> get_coboundary_size_and_gap_and_pivot(filtration_entry_t a) const {
		// Look at the first two gaps of the pivot and the next element
		index_t pivot = 0;
		size_t gap_after_pivot = 0;
		auto iterator = complex.coboundary(a);
		size_t coboundary_size = 0;
		while (iterator.has_next()) {
			coboundary_size++;
			index_t next_index = get_index(iterator.next().second);
			if (next_index > pivot) {
				gap_after_pivot = next_index - pivot;
				pivot = next_index;
			}
		}

		return std::make_tuple(coboundary_size, gap_after_pivot, pivot);
	}